

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall leveldb::anon_unknown_1::PosixEnv::GetTestDirectory(PosixEnv *this,string *result)

{
  size_type __len1;
  __uid_t _Var1;
  char *__s;
  size_t __len2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_FS_OFFSET;
  char buf [100];
  void *local_a0;
  char local_98 [104];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __s = getenv("TEST_TMPDIR");
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    _Var1 = geteuid();
    __s = local_98;
    snprintf(__s,100,"/tmp/leveldbtest-%d",(ulong)_Var1);
  }
  __len1 = in_RDX->_M_string_length;
  __len2 = strlen(__s);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (in_RDX,0,__len1,__s,__len2);
  (**(code **)((result->_M_dataplus)._M_p + 0x48))(&local_a0,result);
  if (local_a0 != (void *)0x0) {
    operator_delete__(local_a0);
  }
  (this->super_Env)._vptr_Env = (_func_int **)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status GetTestDirectory(std::string* result) override {
    const char* env = std::getenv("TEST_TMPDIR");
    if (env && env[0] != '\0') {
      *result = env;
    } else {
      char buf[100];
      std::snprintf(buf, sizeof(buf), "/tmp/leveldbtest-%d",
                    static_cast<int>(::geteuid()));
      *result = buf;
    }

    // The CreateDir status is ignored because the directory may already exist.
    CreateDir(*result);

    return Status::OK();
  }